

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O2

shared_ptr<tonk::gateway::MappedPortLifetime>
tonk::gateway::RequestPortMap(uint16_t localPort,char *interfaceAddress)

{
  ulong uVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  char *pcVar3;
  OutputWorker *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined6 in_register_0000003a;
  element_type *peVar4;
  shared_ptr<tonk::gateway::MappedPortLifetime> sVar5;
  Result result;
  string local_1c0;
  shared_ptr<tonk::gateway::MappedPortLifetime> ref;
  ostringstream local_190 [376];
  
  peVar4 = (element_type *)CONCAT62(in_register_0000003a,localPort);
  std::mutex::lock((mutex *)APILock);
  if (API_References < 1) {
    Delete_PortMapper();
    pcVar3 = (char *)operator_new(0x18,(nothrow_t *)&std::nothrow);
    if (pcVar3 == (char *)0x0) {
      m_PortMapper = (char *)0x0;
      (peVar4->Request).LocalPort = 0;
      *(undefined2 *)&(peVar4->Request).field_0x2 = 0;
      (peVar4->Request).Type = Add;
      (peVar4->Request).API_LifetimePtr = (MappedPortLifetime *)0x0;
      goto LAB_0012e2b5;
    }
    pcVar3[0x10] = '\0';
    pcVar3[0x11] = '\0';
    pcVar3[0x12] = '\0';
    pcVar3[0x13] = '\0';
    pcVar3[0x14] = '\0';
    pcVar3[0x15] = '\0';
    pcVar3[0x16] = '\0';
    pcVar3[0x17] = '\0';
    m_PortMapper = pcVar3;
    pcVar3[0] = '\0';
    pcVar3[1] = '\0';
    pcVar3[2] = '\0';
    pcVar3[3] = '\0';
    pcVar3[4] = '\0';
    pcVar3[5] = '\0';
    pcVar3[6] = '\0';
    pcVar3[7] = '\0';
    pcVar3[8] = '\0';
    pcVar3[9] = '\0';
    pcVar3[10] = '\0';
    pcVar3[0xb] = '\0';
    pcVar3[0xc] = '\0';
    pcVar3[0xd] = '\0';
    pcVar3[0xe] = '\0';
    pcVar3[0xf] = '\0';
    GatewayPortMapper::Initialize((GatewayPortMapper *)&result,pcVar3);
    if (result.Error != (ErrorResult *)0x0) {
      Result::ToJson_abi_cxx11_(&local_1c0,&result);
      if (DAT_0019e060 < 5) {
        ref.super___shared_ptr<tonk::gateway::MappedPortLifetime,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = ModuleLogger;
        ref.super___shared_ptr<tonk::gateway::MappedPortLifetime,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._0_4_ = 4;
        std::__cxx11::ostringstream::ostringstream(local_190);
        std::operator<<((ostream *)local_190,(string *)&DAT_0019e090);
        std::operator<<((ostream *)local_190,"Unable to initialize port mapper: ");
        std::operator<<((ostream *)local_190,(string *)&local_1c0);
        this = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(this,(LogStringBuffer *)&ref);
        std::__cxx11::ostringstream::~ostringstream(local_190);
      }
      std::__cxx11::string::~string((string *)&local_1c0);
      Delete_PortMapper();
      (peVar4->Request).LocalPort = 0;
      *(undefined2 *)&(peVar4->Request).field_0x2 = 0;
      (peVar4->Request).Type = Add;
      (peVar4->Request).API_LifetimePtr = (MappedPortLifetime *)0x0;
      Result::~Result(&result);
      goto LAB_0012e2b5;
    }
    Result::~Result(&result);
  }
  MakeSharedNoThrow<tonk::gateway::MappedPortLifetime>();
  pcVar3 = m_PortMapper;
  if (ref.super___shared_ptr<tonk::gateway::MappedPortLifetime,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      == (element_type *)0x0) {
    (peVar4->Request).LocalPort = 0;
    *(undefined2 *)&(peVar4->Request).field_0x2 = 0;
    (peVar4->Request).Type = Add;
    (peVar4->Request).API_LifetimePtr = (MappedPortLifetime *)0x0;
  }
  else {
    if (m_PortMapper != (char *)0x0) {
      local_1c0._M_dataplus._M_p._4_4_ = 0;
      local_1c0._M_string_length =
           (size_type)
           ref.super___shared_ptr<tonk::gateway::MappedPortLifetime,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      uVar1 = (ulong)CONCAT22(local_1c0._M_dataplus._M_p._2_2_,(short)interfaceAddress);
      ((ref.super___shared_ptr<tonk::gateway::MappedPortLifetime,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       )->Request).LocalPort = (short)uVar1;
      *(short *)&((ref.
                   super___shared_ptr<tonk::gateway::MappedPortLifetime,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->Request).field_0x2 = (short)(uVar1 >> 0x10);
      ((ref.super___shared_ptr<tonk::gateway::MappedPortLifetime,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       )->Request).Type = (int)(uVar1 >> 0x20);
      ((ref.super___shared_ptr<tonk::gateway::MappedPortLifetime,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       )->Request).API_LifetimePtr =
           ref.super___shared_ptr<tonk::gateway::MappedPortLifetime,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      local_1c0._M_dataplus._M_p._0_2_ = (short)interfaceAddress;
      StateMachine::API_Request(*(StateMachine **)(pcVar3 + 0x10),(AppRequest *)&local_1c0);
    }
    _Var2._M_pi = ref.
                  super___shared_ptr<tonk::gateway::MappedPortLifetime,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    *(element_type **)&peVar4->Request =
         ref.super___shared_ptr<tonk::gateway::MappedPortLifetime,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    ref.super___shared_ptr<tonk::gateway::MappedPortLifetime,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    API_References = API_References + 1;
    ref.super___shared_ptr<tonk::gateway::MappedPortLifetime,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (peVar4->Request).API_LifetimePtr = (MappedPortLifetime *)_Var2._M_pi;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ref.super___shared_ptr<tonk::gateway::MappedPortLifetime,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
LAB_0012e2b5:
  pthread_mutex_unlock((pthread_mutex_t *)APILock);
  sVar5.super___shared_ptr<tonk::gateway::MappedPortLifetime,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar5.super___shared_ptr<tonk::gateway::MappedPortLifetime,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar4;
  return (shared_ptr<tonk::gateway::MappedPortLifetime>)
         sVar5.super___shared_ptr<tonk::gateway::MappedPortLifetime,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<MappedPortLifetime> RequestPortMap(
    uint16_t localPort,
    const char* interfaceAddress)
{
    std::lock_guard<std::mutex> locker(APILock);

    // If initialization is needed:
    TONK_DEBUG_ASSERT(API_References >= 0);
    if (API_References <= 0)
    {
        TONK_DEBUG_ASSERT(m_PortMapper == nullptr);
        Delete_PortMapper();

        // Allocate port mapper
        m_PortMapper = new(std::nothrow) GatewayPortMapper;
        if (!m_PortMapper) {
            return nullptr; // OOM
        }

        // Initialize background thread and Asio objects
        Result result = m_PortMapper->Initialize(interfaceAddress);
        if (result.IsFail())
        {
            ModuleLogger.Error("Unable to initialize port mapper: ", result.ToJson());
            Delete_PortMapper();
            return nullptr;
        }
    }

    // Create a request lifetime object
    std::shared_ptr<MappedPortLifetime> ref = MakeSharedNoThrow<MappedPortLifetime>();
    if (!ref) {
        return nullptr; // OOM
    }

    // Put in request
    TONK_DEBUG_ASSERT(m_PortMapper);
    if (m_PortMapper)
    {
        AppRequest request;
        request.LocalPort = localPort;
        request.Type = RequestType::Add;
        request.API_LifetimePtr = ref.get();

        ref->Request = request;

        // Insert request
        m_PortMapper->State->API_Request(request);
    }

    // Increment references to API
    ++API_References;

    return ref;
}